

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::rename_file(torrent *this,file_index_t index,string *name)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  _func_int **pp_Var4;
  element_type *peVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_98 [20];
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_84;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [20];
  error_code_enum local_5c;
  pointer local_58;
  pointer pfStack_50;
  pointer local_48;
  __uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
  _Stack_40;
  
  pp_Var4 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger;
  local_84.m_val = index.m_val;
  if ((this->m_storage).m_disk_io == (disk_interface *)0x0) {
    iVar8 = (*pp_Var4[5])();
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar8) + 0x68) & 8) != 0) {
      iVar8 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_98);
      local_5c = session_is_closing;
      alert_manager::
      emplace_alert<libtorrent::file_rename_failed_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&,libtorrent::errors::error_code_enum>
                ((alert_manager *)CONCAT44(extraout_var_01,iVar8),(torrent_handle *)local_98,
                 &local_84,&local_5c);
      if ((piece_picker *)local_98._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_98._8_8_ + 0xc);
          iVar8 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar8 = *(_Atomic_word *)(local_98._8_8_ + 0xc);
          *(int *)(local_98._8_8_ + 0xc) = iVar8 + -1;
        }
        if (iVar8 == 1) {
          (*(*(_func_int ***)local_98._8_8_)[3])();
        }
      }
    }
  }
  else {
    iVar8 = (*pp_Var4[4])();
    uVar3 = (this->m_storage).m_idx.m_val;
    local_80 = (element_type *)local_70;
    peVar5 = (element_type *)(name->_M_dataplus)._M_p;
    paVar2 = &name->field_2;
    if (peVar5 == (element_type *)paVar2) {
      local_70._0_8_ = paVar2->_M_allocated_capacity;
      local_70._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    }
    else {
      local_70._0_8_ = paVar2->_M_allocated_capacity;
      local_80 = peVar5;
    }
    local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name->_M_string_length;
    (name->_M_dataplus)._M_p = (pointer)paVar2;
    name->_M_string_length = 0;
    (name->field_2)._M_local_buf[0] = '\0';
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_98,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    uVar7 = local_98._8_8_;
    uVar6 = local_98._0_8_;
    local_98._0_8_ = (_func_int **)0x0;
    local_98._8_8_ =
         (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
          )0x0;
    local_58 = (pointer)0x0;
    pfStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    _Stack_40._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
    .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
         (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
         (_Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
          )0x0;
    local_58 = (pointer)operator_new(0x20);
    *(code **)local_58 = on_file_renamed;
    *(undefined8 *)&local_58->field_0x8 = 0;
    local_58->name = (char *)uVar6;
    local_58->root = (char *)uVar7;
    _Stack_40._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
    .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
         (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
         ::std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_const_libtorrent::storage_error_&),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_const_libtorrent::storage_error_&)>_>
         ::_M_invoke;
    local_48 = (pointer)::std::
                        _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_const_libtorrent::storage_error_&),_std::_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_const_libtorrent::storage_error_&)>_>
                        ::_M_manager;
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x50))
              ((long *)CONCAT44(extraout_var,iVar8),uVar3,index.m_val,&local_80);
    if (local_48 != (pointer)0x0) {
      (*(code *)local_48)(&local_58,&local_58,3);
    }
    if ((piece_picker *)local_98._8_8_ != (piece_picker *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    if (local_80 != (element_type *)local_70) {
      operator_delete(local_80,local_70._0_8_ + 1);
    }
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  return;
}

Assistant:

void torrent::rename_file(file_index_t const index, std::string name)
	{
		INVARIANT_CHECK;

		file_storage const& fs = m_torrent_file->files();
		TORRENT_ASSERT(index >= file_index_t(0));
		TORRENT_ASSERT(index < fs.end_file());
		TORRENT_UNUSED(fs);

		// storage may be nullptr during shutdown
		if (!m_storage)
		{
			if (alerts().should_post<file_rename_failed_alert>())
				alerts().emplace_alert<file_rename_failed_alert>(get_handle()
					, index, errors::session_is_closing);
			return;
		}

		m_ses.disk_thread().async_rename_file(m_storage, index, std::move(name)
			, std::bind(&torrent::on_file_renamed, shared_from_this(), _1, _2, _3));
		m_ses.deferred_submit_jobs();
	}